

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall Character::ShowBoard(Character *this,Board *board)

{
  World *pWVar1;
  size_t sVar2;
  size_t __n;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  long *plVar9;
  long *plVar10;
  size_type *psVar11;
  int iVar12;
  key_type *__k;
  Character *pCVar13;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  double dVar16;
  string author_extra;
  string subject_extra;
  PacketBuilder builder;
  key_type local_128;
  int local_104;
  key_type local_100;
  key_type local_e0;
  Character *local_c0;
  double local_b8;
  double local_b0;
  _List_node_base *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  undefined1 local_80 [48];
  string local_50;
  
  if (board == (Board *)0x0) {
    board = this->board;
  }
  pWVar1 = this->world;
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"BoardDatePosts","");
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,(key_type *)local_80);
  bVar4 = util::variant::GetBool(pmVar8);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  sVar2 = (board->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
          _M_node._M_size;
  pWVar1 = this->world;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_c0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"BoardMaxSubjectLength","");
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,&local_128);
  iVar5 = util::variant::GetInt(pmVar8);
  iVar12 = iVar5 + 0x22;
  if (!bVar4) {
    iVar12 = iVar5 + 0x11;
  }
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_80,PACKET_BOARD,PACKET_OPEN,sVar2 * (long)iVar12 + 2);
  pCVar13 = local_c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  PacketBuilder::AddChar((PacketBuilder *)local_80,(char)board->id + '\x01');
  PacketBuilder::AddChar
            ((PacketBuilder *)local_80,
             (uchar)(board->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>.
                    _M_impl._M_node._M_size);
  local_a8 = (_List_node_base *)&board->posts;
  p_Var15 = (((list<Board_Post_*,_std::allocator<Board_Post_*>_> *)local_a8)->
            super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var15 == local_a8) {
    local_104 = 0;
    iVar12 = 0;
  }
  else {
    iVar12 = 0;
    local_104 = 0;
    do {
      p_Var14 = p_Var15[1]._M_next;
      (*(pCVar13->player->character->super_Command_Source)._vptr_Command_Source[2])(&local_128);
      _Var3._M_p = local_128._M_dataplus._M_p;
      __n = (size_t)p_Var14[1]._M_next;
      if (__n == local_128._M_string_length) {
        if (__n == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp(p_Var14->_M_prev,local_128._M_dataplus._M_p,__n);
          bVar4 = iVar5 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_128.field_2) {
        operator_delete(_Var3._M_p,
                        CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                 local_128.field_2._M_local_buf[0]) + 1);
      }
      pCVar13 = local_c0;
      if (bVar4) {
        local_b0 = (double)p_Var14[7]._M_next;
        pWVar1 = local_c0->world;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"BoardRecentPostTime","");
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar1->config,&local_128);
        iVar5 = util::variant::GetInt(pmVar8);
        dVar16 = Timer::GetTime();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          local_b8 = dVar16;
          operator_delete(local_128._M_dataplus._M_p,
                          CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                   local_128.field_2._M_local_buf[0]) + 1);
          dVar16 = local_b8;
        }
        iVar12 = iVar12 + 1;
        if (dVar16 < local_b0 + (double)iVar5) {
          local_104 = local_104 + 1;
        }
      }
      p_Var15 = p_Var15->_M_next;
    } while (p_Var15 != local_a8);
  }
  pWVar1 = pCVar13->world;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"BoardMaxUserPosts","");
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,&local_128);
  p_Var15 = local_a8;
  iVar6 = util::variant::GetInt(pmVar8);
  pWVar1 = pCVar13->world;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"BoardMaxUserRecentPosts","")
  ;
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,&local_100);
  iVar7 = util::variant::GetInt(pmVar8);
  iVar5 = iVar7 - local_104;
  if (iVar6 - iVar12 <= iVar7 - local_104) {
    iVar5 = iVar6 - iVar12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  local_b0 = (double)CONCAT44(local_b0._4_4_,iVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  p_Var14 = (((_List_base<Board_Post_*,_std::allocator<Board_Post_*>_> *)&p_Var15->_M_next)->_M_impl
            )._M_node.super__List_node_base._M_next;
  if (p_Var14 != p_Var15) {
    do {
      p_Var15 = p_Var14[1]._M_next;
      PacketBuilder::AddShort((PacketBuilder *)local_80,*(unsigned_short *)&p_Var15->_M_next);
      PacketBuilder::AddByte((PacketBuilder *)local_80,0xff);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      if (0 < local_b0._0_4_) {
        std::__cxx11::string::_M_replace((ulong)&local_128,0,(char *)0x0,0x1d699e);
      }
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var15->_M_prev,&local_128);
      PacketBuilder::AddBreakString((PacketBuilder *)local_80,&local_100,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      pWVar1 = local_c0->world;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      __k = &local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)__k,"BoardDatePosts","");
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,__k);
      bVar4 = util::variant::GetBool(pmVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        __k = (key_type *)(local_e0.field_2._M_allocated_capacity + 1);
        operator_delete(local_e0._M_dataplus._M_p,(ulong)__k);
      }
      if (bVar4) {
        local_b8 = (double)p_Var15[7]._M_next;
        dVar16 = Timer::GetTime();
        util::timeago_abi_cxx11_(&local_50,(util *)__k,local_b8,dVar16);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1d7ec1);
        plVar10 = plVar9 + 2;
        if ((long *)*plVar9 == plVar10) {
          local_90 = *plVar10;
          lStack_88 = plVar9[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar10;
          local_a0 = (long *)*plVar9;
        }
        local_98 = plVar9[1];
        *plVar9 = (long)plVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0.field_2._8_8_ = plVar9[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_e0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_100,(string *)&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      std::operator+(&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var15 + 3),&local_100);
      PacketBuilder::AddBreakString((PacketBuilder *)local_80,&local_e0,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                 local_128.field_2._M_local_buf[0]) + 1);
      }
      p_Var14 = p_Var14->_M_next;
    } while (p_Var14 != local_a8);
  }
  EOClient::Send(local_c0->player->client,(PacketBuilder *)local_80);
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_80);
  return;
}

Assistant:

void Character::ShowBoard(Board *board)
{
	if (!board)
	{
		board = this->board;
	}

	const int date_res = (this->world->config["BoardDatePosts"]) ? 17 : 0;

	PacketBuilder builder(PACKET_BOARD, PACKET_OPEN, 2 + board->posts.size() * (17 + int(this->world->config["BoardMaxSubjectLength"]) + date_res));
	builder.AddChar(board->id + 1);
	builder.AddChar(board->posts.size());

	int post_count = 0;
	int recent_post_count = 0;

	UTIL_FOREACH(board->posts, post)
	{
		if (post->author == this->player->character->SourceName())
		{
			++post_count;

			if (post->time + static_cast<int>(this->world->config["BoardRecentPostTime"]) > Timer::GetTime())
			{
				++recent_post_count;
			}
		}
	}

	int posts_remaining = std::min(static_cast<int>(this->world->config["BoardMaxUserPosts"]) - post_count, static_cast<int>(this->world->config["BoardMaxUserRecentPosts"]) - recent_post_count);

	UTIL_FOREACH(board->posts, post)
	{
		builder.AddShort(post->id);
		builder.AddByte(255);

		std::string author_extra;

		if (posts_remaining > 0)
		{
			author_extra = " ";
		}

		builder.AddBreakString(post->author + author_extra);

		std::string subject_extra;

		if (this->world->config["BoardDatePosts"])
		{
			subject_extra = " (" + util::timeago(post->time, Timer::GetTime()) + ")";
		}

		builder.AddBreakString(post->subject + subject_extra);
	}

	this->Send(builder);
}